

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

bool __thiscall
t_ocaml_generator::struct_member_default_cheaply_comparable
          (t_ocaml_generator *this,t_field *tmember)

{
  uint uVar1;
  t_base tVar2;
  t_type *type_00;
  t_base_type *this_00;
  t_const_value *this_01;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *this_02;
  size_type sVar3;
  double dVar4;
  t_const_value *val;
  t_type *type;
  t_field *tmember_local;
  t_ocaml_generator *this_local;
  
  type_00 = t_field::get_type(tmember);
  this_00 = (t_base_type *)t_generator::get_true_type(type_00);
  this_01 = t_field::get_value(tmember);
  if (this_01 == (t_const_value *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[5])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xe])();
      if ((uVar1 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        this_02 = t_const_value::get_list(this_01);
        sVar3 = std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::size(this_02);
        if (sVar3 == 0) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      tVar2 = t_base_type::get_base(this_00);
      if (tVar2 == TYPE_DOUBLE) {
        dVar4 = t_const_value::get_double(this_01);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool t_ocaml_generator::struct_member_default_cheaply_comparable(t_field* tmember) {
  t_type* type = get_true_type(tmember->get_type());
  t_const_value* val = tmember->get_value();
  if (!val) {
    return false;
  } else if (type->is_base_type()) {
    // Base types are generally cheaply compared for structural equivalence.
    switch (((t_base_type*)type)->get_base()) {
    case t_base_type::TYPE_DOUBLE:
      if (val->get_double() == 0.0)
        return true;
      else
        return false;
    default:
      return true;
    }
  } else if (type->is_list()) {
    // Empty lists are cheaply compared for structural equivalence.
    // Is empty list?
    if (val->get_list().size() == 0)
      return true;
    else
      return false;
  } else {
    return false;
  }
}